

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

GLFWbool waitForData(pollfd *fds,nfds_t count,double *timeout)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  uint64_t uVar4;
  long lVar5;
  double *in_RDX;
  nfds_t in_RSI;
  pollfd *in_RDI;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int result_1;
  int error;
  int result;
  timespec ts;
  long nanoseconds;
  time_t seconds;
  uint64_t base;
  timespec local_48;
  long local_38;
  long local_30;
  uint64_t local_28;
  double *local_20;
  nfds_t local_18;
  pollfd *local_10;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  do {
    while (local_20 != (double *)0x0) {
      local_28 = _glfwPlatformGetTimerValue();
      local_48.tv_sec = (__time_t)*local_20;
      local_48.tv_nsec = (long)((*local_20 - (double)local_48.tv_sec) * 1000000000.0);
      local_38 = local_48.tv_nsec;
      local_30 = local_48.tv_sec;
      iVar1 = ppoll(local_10,local_18,&local_48,(__sigset_t *)0x0);
      piVar3 = __errno_location();
      iVar2 = *piVar3;
      uVar4 = _glfwPlatformGetTimerValue();
      lVar5 = uVar4 - local_28;
      auVar6._8_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar6._0_8_ = lVar5;
      auVar6._12_4_ = 0x45300000;
      uVar4 = _glfwPlatformGetTimerFrequency();
      auVar7._8_4_ = (int)(uVar4 >> 0x20);
      auVar7._0_8_ = uVar4;
      auVar7._12_4_ = 0x45300000;
      *local_20 = *local_20 -
                  ((auVar6._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) /
                  ((auVar7._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0));
      if (0 < iVar1) {
        return 1;
      }
      if (((iVar1 == -1) && (iVar2 != 4)) && (iVar2 != 0xb)) {
        return 0;
      }
      if (*local_20 <= 0.0) {
        return 0;
      }
    }
    iVar2 = poll(local_10,local_18,-1);
    if (0 < iVar2) {
      return 1;
    }
  } while (((iVar2 != -1) || (piVar3 = __errno_location(), *piVar3 == 4)) ||
          (piVar3 = __errno_location(), *piVar3 == 0xb));
  return 0;
}

Assistant:

static GLFWbool waitForData(struct pollfd* fds, nfds_t count, double* timeout)
{
    for (;;)
    {
        if (timeout)
        {
            const uint64_t base = _glfwPlatformGetTimerValue();

#if defined(__linux__) || defined(__FreeBSD__) || defined(__OpenBSD__) || defined(__CYGWIN__)
            const time_t seconds = (time_t) *timeout;
            const long nanoseconds = (long) ((*timeout - seconds) * 1e9);
            const struct timespec ts = { seconds, nanoseconds };
            const int result = ppoll(fds, count, &ts, NULL);
#elif defined(__NetBSD__)
            const time_t seconds = (time_t) *timeout;
            const long nanoseconds = (long) ((*timeout - seconds) * 1e9);
            const struct timespec ts = { seconds, nanoseconds };
            const int result = pollts(fds, count, &ts, NULL);
#else
            const int milliseconds = (int) (*timeout * 1e3);
            const int result = poll(fds, count, milliseconds);
#endif
            const int error = errno; // clock_gettime may overwrite our error

            *timeout -= (_glfwPlatformGetTimerValue() - base) /
                (double) _glfwPlatformGetTimerFrequency();

            if (result > 0)
                return GLFW_TRUE;
            else if (result == -1 && error != EINTR && error != EAGAIN)
                return GLFW_FALSE;
            else if (*timeout <= 0.0)
                return GLFW_FALSE;
        }
        else
        {
            const int result = poll(fds, count, -1);
            if (result > 0)
                return GLFW_TRUE;
            else if (result == -1 && errno != EINTR && errno != EAGAIN)
                return GLFW_FALSE;
        }
    }
}